

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_sqrt_estimate(sexp ctx,sexp a)

{
  sexp_uint_t sVar1;
  sexp psVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  sexp local_38;
  sexp_gc_var_t local_30;
  
  sVar1 = sexp_bignum_hi(a);
  local_38 = (sexp)0x43e;
  iVar5 = (int)sVar1 << 6;
  uVar4 = 0x3f;
  uVar3 = 0x3f;
  while( true ) {
    bVar6 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if ((bVar6) || ((*(ulong *)((long)&a->value + sVar1 * 8 + 8) >> (uVar4 & 0x3f) & 1) != 0))
    break;
    iVar5 = iVar5 + -1;
    uVar4 = (ulong)uVar3;
  }
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  local_30.var = &local_38;
  local_38 = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000005);
  psVar2 = sexp_bignum_expt(ctx,local_38,(sexp)((long)(iVar5 / 2) * 2 + 1));
  (ctx->value).context.saves = local_30.next;
  return psVar2;
}

Assistant:

sexp sexp_bignum_sqrt_estimate (sexp ctx, sexp a) {
  sexp_uint_t alen=sexp_bignum_hi(a), adata_hi;
  int nbits, i;
  sexp_gc_var1(res);

  adata_hi = sexp_bignum_data(a)[alen - 1];
  for (i = sizeof(sexp_uint_t)*8-1; i > 0; i--)
    if (adata_hi & (1ul << i))
      break;
  nbits = sizeof(sexp_uint_t) * 8 * (alen - 1) + i + 1;

  sexp_gc_preserve1(ctx, res);
  res = sexp_fixnum_to_bignum(ctx, SEXP_TWO);
  res = sexp_bignum_expt(ctx, res, sexp_make_fixnum(nbits / 2));
  sexp_gc_release1(ctx);
  return res;
}